

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  pointer pcVar1;
  int iVar2;
  ostream *poVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RCX;
  uchar *sig;
  uchar *in_R8;
  size_t in_R9;
  string check_str;
  tree ntree;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  char local_e9;
  picosha2 *local_e8;
  long local_e0;
  picosha2 local_d8 [16];
  undefined1 local_c8 [64];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_e8 = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter Merkle Leafes: ",0x15);
  local_c8[0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_c8,1);
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar1 = local_c8 + 0x10;
  do {
    local_c8._8_8_ = (pointer)0x0;
    local_c8[0x10] = '\0';
    local_c8._0_8_ = pcVar1;
    std::operator>>((istream *)&std::cin,(string *)local_c8);
    iVar2 = std::__cxx11::string::compare((char *)local_c8);
    if (iVar2 != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_88,(value_type *)local_c8);
    }
    if ((pointer)local_c8._0_8_ != pcVar1) {
      operator_delete((void *)local_c8._0_8_);
    }
  } while (iVar2 != 0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter Leaf to verify: ",0x16);
  local_c8[0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_c8,1);
  std::operator>>((istream *)&std::cin,(string *)&local_e8);
  picosha2::hash256_hex_string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)local_c8,local_e8,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(local_e8 + local_e0),in_RCX);
  std::__cxx11::string::operator=((string *)&local_e8,(string *)local_c8);
  if ((pointer)local_c8._0_8_ != pcVar1) {
    operator_delete((void *)local_c8._0_8_);
  }
  tree::tree((tree *)local_c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_68,&local_88);
  tree::buildBaseLeafes((tree *)local_c8,&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  tree::buildTree((tree *)local_c8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Check if: ",10);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_e8,local_e0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," is contained in tree",0x15);
  local_e9 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_e9,1);
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)local_50,local_e8,local_e8 + local_e0);
  iVar2 = tree::verify((tree *)local_c8,(EVP_PKEY_CTX *)local_50,sig,(size_t)in_RCX._M_current,in_R8
                       ,in_R9);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (iVar2 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Nope something is wrong",0x17);
    local_e9 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_e9,1);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"All Clear",9);
    local_e9 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_e9,1);
  }
  tree::~tree((tree *)local_c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  if (local_e8 != local_d8) {
    operator_delete(local_e8);
  }
  return 0;
}

Assistant:

int main(int argc, char const *argv[]) {


  string check_str = "";

  std::cout << "Enter Merkle Leafes: " << '\n';
  std::vector<string> v;

  while(1) {
    string str;
    std::cin >> str;
    if(str != ";")
      v.push_back(str);
    else
      break;
  }

  std::cout << "Enter Leaf to verify: " << '\n';

  cin >> check_str;

  check_str = picosha2::hash256_hex_string(check_str);


  tree ntree;

  ntree.buildBaseLeafes(v);
  ntree.buildTree();

  std::cout << "Check if: " << check_str << " is contained in tree" << '\n';

  if(ntree.verify(check_str)){
    std::cout << "All Clear" << '\n';
  } else {
      std::cout << "Nope something is wrong" << '\n';
  }



  return 0;
}